

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdas_obj.cpp
# Opt level: O1

uint32_t parseNumber(FileStackNode *where,uint32_t lineNo,char *str,NumberType base)

{
  bool bVar1;
  int __c;
  uint32_t uVar2;
  void *pvVar3;
  char *unaff_RBP;
  char *pcVar4;
  uint32_t unaff_R14D;
  char *pcVar5;
  
  if (*str == '\0') {
    fatal(where,lineNo,"Expected number, got empty string");
  }
  uVar2 = 0;
  pcVar5 = str;
  do {
    pcVar4 = pcVar5;
    __c = toupper((int)*pcVar4);
    pvVar3 = memchr("0123456789ABCDEF",__c,0x11);
    if ((pvVar3 == (void *)0x0) || ((long)(ulong)base <= (long)pvVar3 + -0x10ed61)) {
      bVar1 = false;
      pcVar5 = pcVar4;
      unaff_R14D = uVar2;
    }
    else {
      pcVar5 = pcVar4 + 1;
      uVar2 = (int)((long)pvVar3 + -0x10ed61) + uVar2 * base;
      bVar1 = true;
      pcVar4 = unaff_RBP;
    }
    unaff_RBP = pcVar4;
  } while (bVar1);
  if (*pcVar4 == '\0') {
    return unaff_R14D;
  }
  fatal(where,lineNo,"Expected number, got \"%s\"",str);
}

Assistant:

static uint32_t parseNumber(struct FileStackNode const *where, uint32_t lineNo, char const *restrict str, enum NumberType base) {
	if (str[0] == '\0')
		fatal(where, lineNo, "Expected number, got empty string");

	char const *endptr;
	uint32_t res = readNumber(str, &endptr, base);

	if (*endptr != '\0')
		fatal(where, lineNo, "Expected number, got \"%s\"", str);
	return res;
}